

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_threshold.hpp
# Opt level: O0

void re::math::adaptive_threshold<7l,float,512l,512l>
               (span<const_float,_512L> in,span<float,_512L> out)

{
  reference peVar1;
  reference peVar2;
  reference pfVar3;
  double dVar4;
  element_type local_60;
  int local_5c;
  float in_value;
  int i;
  ring_array<float,_7UL> temp;
  int_t count;
  float sum;
  index_type n;
  span<float,_512L> out_local;
  span<const_float,_512L> in_local;
  
  count._4_4_ = 0.0;
  temp.c._M_elems[6] = 0.0;
  temp._36_4_ = 0;
  n = (index_type)out.storage_.data_;
  out_local.storage_.data_ =
       (storage_type<gsl::details::extent_type<512L>_>)
       (storage_type<gsl::details::extent_type<512L>_>)in.storage_.data_;
  ring_array<float,_7UL>::ring_array((ring_array<float,_7UL> *)&in_value);
  for (local_5c = 0; local_5c < 0x207; local_5c = local_5c + 1) {
    if (local_5c < 0x200) {
      peVar1 = gsl::span<const_float,_512L>::operator[]
                         ((span<const_float,_512L> *)&out_local,(long)local_5c);
      count._4_4_ = *peVar1 + count._4_4_;
      temp._32_8_ = temp._32_8_ + 1;
    }
    if (6 < local_5c) {
      peVar1 = gsl::span<const_float,_512L>::operator[]
                         ((span<const_float,_512L> *)&out_local,(long)local_5c + -7);
      local_60 = *peVar1;
      dVar4 = std::fdim((double)(ulong)(uint)local_60,
                        (double)(ulong)(uint)(count._4_4_ / (float)(long)temp._32_8_));
      peVar2 = gsl::span<float,_512L>::operator[]((span<float,_512L> *)&n,(long)local_5c + -7);
      *peVar2 = SUB84(dVar4,0);
      if (0xe < local_5c) {
        pfVar3 = ring_array<float,_7UL>::front((ring_array<float,_7UL> *)&in_value);
        count._4_4_ = count._4_4_ - *pfVar3;
        temp._32_8_ = temp._32_8_ + -1;
      }
      ring_array<float,_7UL>::push_back((ring_array<float,_7UL> *)&in_value,&local_60);
    }
  }
  return;
}

Assistant:

void
adaptive_threshold(
    gsl::span<T const, N_in> in,
    gsl::span<T, N_out> out
) noexcept {
    assert(std::size(in) == std::size(out));
    auto const n = std::size(in);

    assert(n >= 2*Radius);
    T sum = 0;
    int_t count = 0;
    ring_array<T, Radius> temp;

    for (auto i = 0; i < n + Radius; ++i) {
        if (i < n) {
            sum += in[i];
            ++count;
        }
        if (i >= Radius) {
            auto const in_value = in[i - Radius];
            out[i - Radius] = std::fdim(in_value, sum / count);
            if (i > 2*Radius) {
                sum -= temp.front();
                --count;
            }
            temp.push_back(in_value);
        }
    }
}